

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputAESDecodeStream.cpp
# Opt level: O0

void __thiscall
InputAESDecodeStream::Assign(InputAESDecodeStream *this,IByteReader *inSourceReader,ByteList *inKey)

{
  bool bVar1;
  size_type sVar2;
  uchar *puVar3;
  reference puVar4;
  _Self local_38;
  long local_30;
  size_t i;
  const_iterator it;
  ByteList *inKey_local;
  IByteReader *inSourceReader_local;
  InputAESDecodeStream *this_local;
  
  this->mSourceStream = inSourceReader;
  it._M_node = (_List_node_base *)inKey;
  sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inKey);
  this->mKeyLength = sVar2;
  puVar3 = (uchar *)operator_new__(this->mKeyLength);
  this->mKey = puVar3;
  i = (size_t)std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((list<unsigned_char,_std::allocator<unsigned_char>_> *)it._M_node);
  local_30 = 0;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end(it._M_node);
    bVar1 = std::operator!=((_Self *)&i,&local_38);
    if (!bVar1) break;
    puVar4 = std::_List_const_iterator<unsigned_char>::operator*
                       ((_List_const_iterator<unsigned_char> *)&i);
    this->mKey[local_30] = *puVar4;
    local_30 = local_30 + 1;
    std::_List_const_iterator<unsigned_char>::operator++((_List_const_iterator<unsigned_char> *)&i);
  }
  AESdecrypt::key(&this->mDecrypt,this->mKey,(int)this->mKeyLength);
  this->mIsIvInit = false;
  this->mReadBlockSize = '\x10';
  this->mOutIndex = this->mOut + (int)(uint)this->mReadBlockSize;
  this->mHitEnd = false;
  return;
}

Assistant:

void InputAESDecodeStream::Assign(IByteReader* inSourceReader, const ByteList& inKey)
{
	mSourceStream = inSourceReader;

	// convert inEncryptionKey to internal rep and init decrypt [let's hope its 16...]
	mKeyLength = inKey.size();
	mKey = new unsigned char[mKeyLength];
	ByteList::const_iterator it = inKey.begin();
	size_t i = 0;
	for (; it != inKey.end(); ++i, ++it)
		mKey[i] = *it;
	mDecrypt.key(mKey, mKeyLength);
	mIsIvInit = false; // first read flag. still need to read IV
	mReadBlockSize = AES_BLOCK_SIZE;
	mOutIndex = mOut + mReadBlockSize;
	mHitEnd = false;
}